

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_ARB_ES2_compatibility(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_ARB_ES2_compatibility != 0) {
    glad_glReleaseShaderCompiler =
         (PFNGLRELEASESHADERCOMPILERPROC)(*load)("glReleaseShaderCompiler");
    glad_glShaderBinary = (PFNGLSHADERBINARYPROC)(*load)("glShaderBinary");
    glad_glGetShaderPrecisionFormat =
         (PFNGLGETSHADERPRECISIONFORMATPROC)(*load)("glGetShaderPrecisionFormat");
    glad_glDepthRangef = (PFNGLDEPTHRANGEFPROC)(*load)("glDepthRangef");
    glad_glClearDepthf = (PFNGLCLEARDEPTHFPROC)(*load)("glClearDepthf");
  }
  return;
}

Assistant:

static void load_GL_ARB_ES2_compatibility(GLADloadproc load) {
	if(!GLAD_GL_ARB_ES2_compatibility) return;
	glad_glReleaseShaderCompiler = (PFNGLRELEASESHADERCOMPILERPROC)load("glReleaseShaderCompiler");
	glad_glShaderBinary = (PFNGLSHADERBINARYPROC)load("glShaderBinary");
	glad_glGetShaderPrecisionFormat = (PFNGLGETSHADERPRECISIONFORMATPROC)load("glGetShaderPrecisionFormat");
	glad_glDepthRangef = (PFNGLDEPTHRANGEFPROC)load("glDepthRangef");
	glad_glClearDepthf = (PFNGLCLEARDEPTHFPROC)load("glClearDepthf");
}